

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocDecommittedPages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *node;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar8;
  char *pcVar9;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *toList_00;
  undefined8 *in_FS_OFFSET;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *toList;
  uint recommitPageCount;
  char *pages;
  uint oldDecommitPageCount;
  uint oldFreePageCount;
  PageSegmentBase<Memory::VirtualAllocWrapper> *freeSegment;
  EditingIterator i;
  PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment_local;
  uint pageCount_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  i.super_Iterator.current = (NodeBase *)pageSegment;
  uVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x45c,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator::
  EditingIterator((EditingIterator *)&freeSegment,&this->decommitSegments);
  while( true ) {
    if (i.super_Iterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pPVar8 = freeSegment;
    node = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                     (&(i.super_Iterator.list)->
                       super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
    bVar3 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::IsHead
                      ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *
                       )pPVar8,node);
    if (bVar3) break;
    i.super_Iterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
         DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                   (&(i.super_Iterator.list)->
                     super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
    pPVar8 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&freeSegment);
    uVar5 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetFreePageCount(pPVar8);
    uVar6 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetDecommitPageCount(pPVar8);
    pcVar9 = PageSegmentBase<Memory::VirtualAllocWrapper>::DoAllocDecommitPages<false>
                       (pPVar8,pageCount);
    if (pcVar9 != (char *)0x0) {
      sVar1 = this->freePageCount;
      uVar7 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetFreePageCount(pPVar8);
      this->freePageCount = (sVar1 - uVar5) + (ulong)uVar7;
      sVar1 = this->decommitPageCount;
      uVar7 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetDecommitPageCount(pPVar8);
      this->decommitPageCount = (sVar1 - uVar6) + (ulong)uVar7;
      if (this->freePageCount < this->debugMinFreePageCount) {
        this->debugMinFreePageCount = this->freePageCount;
      }
      uVar6 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetFreePageCount(pPVar8);
      LogRecommitPages(this,(ulong)(pageCount - (uVar5 - uVar6)));
      LogAllocPages(this,(ulong)pageCount);
      uVar5 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetDecommitPageCount(pPVar8);
      if (uVar5 == 0) {
        toList_00 = GetSegmentList(this,pPVar8);
        DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator
        ::MoveCurrentTo((EditingIterator *)&freeSegment,toList_00);
      }
      ((i.super_Iterator.current)->next).base =
           (DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)pPVar8;
      return pcVar9;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocDecommittedPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

    while (i.Next())
    {
        TPageSegment * freeSegment = &i.Data();
        uint oldFreePageCount = freeSegment->GetFreePageCount();
        uint oldDecommitPageCount = freeSegment->GetDecommitPageCount();

        char * pages = freeSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
            this->freePageCount = this->freePageCount - oldFreePageCount + freeSegment->GetFreePageCount();

#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount - oldDecommitPageCount + freeSegment->GetDecommitPageCount();
#endif
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
            uint recommitPageCount = pageCount - (oldFreePageCount - freeSegment->GetFreePageCount());
            LogRecommitPages(recommitPageCount);
            LogAllocPages(pageCount);

            if (freeSegment->GetDecommitPageCount() == 0)
            {
                auto toList = GetSegmentList(freeSegment);
                i.MoveCurrentTo(toList);
            }

            *pageSegment = freeSegment;
            return pages;
        }
    }
    return nullptr;
}